

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaDeriveAndValidateFacets(xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypePtr type)

{
  xmlSchemaTypeType xVar1;
  xmlSchemaTypePtr pxVar2;
  xmlSchemaFacetPtr pxVar3;
  xmlNodePtr pxVar4;
  _xmlSchemaFacetLink *p_Var5;
  int iVar6;
  xmlSchemaFacetLinkPtr pxVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  xmlSchemaFacetPtr pxVar10;
  xmlSchemaFacetLinkPtr pxVar11;
  xmlSchemaFacetLinkPtr pxVar12;
  xmlSchemaFacetPtr facet2;
  xmlSchemaFacetPtr pxVar13;
  xmlSchemaFacetPtr facet2_00;
  char *str2;
  xmlSchemaFacetPtr pxVar14;
  xmlSchemaFacetPtr facet1;
  xmlSchemaFacetPtr facet1_00;
  xmlSchemaFacetLinkPtr pxVar15;
  xmlSchemaFacetPtr facet1_01;
  xmlSchemaFacetPtr local_d0;
  xmlSchemaFacetPtr local_c8;
  xmlSchemaFacetPtr local_b8;
  xmlSchemaFacetPtr local_b0;
  xmlSchemaFacetPtr local_a0;
  xmlSchemaFacetPtr local_98;
  xmlSchemaFacetPtr local_90;
  xmlSchemaFacetPtr local_78;
  xmlSchemaFacetPtr local_70;
  xmlSchemaFacetPtr local_58;
  
  pxVar2 = type->baseType;
  pxVar7 = type->facetSet;
  p_Var5 = pxVar7;
  if (pxVar7 == (xmlSchemaFacetLinkPtr)0x0) {
    if (pxVar2->facetSet == (xmlSchemaFacetLinkPtr)0x0) {
      return 0;
    }
    pxVar15 = (xmlSchemaFacetLinkPtr)0x0;
LAB_001be77e:
    pxVar13 = (xmlSchemaFacetPtr)0x0;
    facet1 = (xmlSchemaFacetPtr)0x0;
    pxVar14 = (xmlSchemaFacetPtr)0x0;
    local_78 = (xmlSchemaFacetPtr)0x0;
    local_90 = (xmlSchemaFacetPtr)0x0;
    local_c8 = (xmlSchemaFacetPtr)0x0;
    facet1_01 = (xmlSchemaFacetPtr)0x0;
    local_d0 = (xmlSchemaFacetPtr)0x0;
    facet1_00 = (xmlSchemaFacetPtr)0x0;
  }
  else {
    do {
      pxVar15 = p_Var5;
      p_Var5 = pxVar15->next;
    } while (pxVar15->next != (_xmlSchemaFacetLink *)0x0);
    if (pxVar7 == (xmlSchemaFacetLinkPtr)0x0) goto LAB_001be77e;
    facet1_00 = (xmlSchemaFacetPtr)0x0;
    local_d0 = (xmlSchemaFacetPtr)0x0;
    facet1_01 = (xmlSchemaFacetPtr)0x0;
    local_c8 = (xmlSchemaFacetPtr)0x0;
    local_90 = (xmlSchemaFacetPtr)0x0;
    local_78 = (xmlSchemaFacetPtr)0x0;
    pxVar14 = (xmlSchemaFacetPtr)0x0;
    facet1 = (xmlSchemaFacetPtr)0x0;
    pxVar13 = (xmlSchemaFacetPtr)0x0;
    do {
      pxVar10 = pxVar7->facet;
      switch(pxVar10->type) {
      case XML_SCHEMA_FACET_MININCLUSIVE:
        local_c8 = pxVar10;
        break;
      case XML_SCHEMA_FACET_MINEXCLUSIVE:
        local_d0 = pxVar10;
        break;
      case XML_SCHEMA_FACET_MAXINCLUSIVE:
        facet1_01 = pxVar10;
        break;
      case XML_SCHEMA_FACET_MAXEXCLUSIVE:
        facet1_00 = pxVar10;
        break;
      case XML_SCHEMA_FACET_TOTALDIGITS:
        facet1 = pxVar10;
        break;
      case XML_SCHEMA_FACET_FRACTIONDIGITS:
        pxVar14 = pxVar10;
        break;
      case XML_SCHEMA_FACET_LENGTH:
        pxVar13 = pxVar10;
        break;
      case XML_SCHEMA_FACET_MAXLENGTH:
        local_78 = pxVar10;
        break;
      case XML_SCHEMA_FACET_MINLENGTH:
        local_90 = pxVar10;
      }
      pxVar7 = pxVar7->next;
    } while (pxVar7 != (_xmlSchemaFacetLink *)0x0);
  }
  pxVar7 = pxVar2->facetSet;
  if (pxVar7 == (xmlSchemaFacetLinkPtr)0x0) {
    local_70 = (xmlSchemaFacetPtr)0x0;
    pxVar10 = (xmlSchemaFacetPtr)0x0;
    local_58 = (xmlSchemaFacetPtr)0x0;
    facet2_00 = (xmlSchemaFacetPtr)0x0;
    facet2 = (xmlSchemaFacetPtr)0x0;
    local_a0 = (xmlSchemaFacetPtr)0x0;
    local_98 = (xmlSchemaFacetPtr)0x0;
    local_b0 = (xmlSchemaFacetPtr)0x0;
    local_b8 = (xmlSchemaFacetPtr)0x0;
  }
  else {
    local_b8 = (xmlSchemaFacetPtr)0x0;
    local_b0 = (xmlSchemaFacetPtr)0x0;
    local_98 = (xmlSchemaFacetPtr)0x0;
    local_a0 = (xmlSchemaFacetPtr)0x0;
    facet2 = (xmlSchemaFacetPtr)0x0;
    facet2_00 = (xmlSchemaFacetPtr)0x0;
    local_58 = (xmlSchemaFacetPtr)0x0;
    pxVar10 = (xmlSchemaFacetPtr)0x0;
    local_70 = (xmlSchemaFacetPtr)0x0;
    do {
      pxVar3 = pxVar7->facet;
      switch(pxVar3->type) {
      case XML_SCHEMA_FACET_MININCLUSIVE:
        local_a0 = pxVar3;
        break;
      case XML_SCHEMA_FACET_MINEXCLUSIVE:
        local_b0 = pxVar3;
        break;
      case XML_SCHEMA_FACET_MAXINCLUSIVE:
        local_98 = pxVar3;
        break;
      case XML_SCHEMA_FACET_MAXEXCLUSIVE:
        local_b8 = pxVar3;
        break;
      case XML_SCHEMA_FACET_TOTALDIGITS:
        pxVar10 = pxVar3;
        break;
      case XML_SCHEMA_FACET_FRACTIONDIGITS:
        local_58 = pxVar3;
        break;
      case XML_SCHEMA_FACET_LENGTH:
        local_70 = pxVar3;
        break;
      case XML_SCHEMA_FACET_MAXLENGTH:
        facet2_00 = pxVar3;
        break;
      case XML_SCHEMA_FACET_MINLENGTH:
        facet2 = pxVar3;
      }
      pxVar7 = pxVar7->next;
    } while (pxVar7 != (_xmlSchemaFacetLink *)0x0);
  }
  str2 = (char *)facet2;
  if ((pxVar13 != (xmlSchemaFacetPtr)0x0) &&
     (local_90 != (xmlSchemaFacetPtr)0x0 || local_78 != (xmlSchemaFacetPtr)0x0)) {
    str2 = 
    "It is an error for both \'length\' and either of \'minLength\' or \'maxLength\' to be specified on the same type definition"
    ;
    xmlSchemaPCustomErrExt
              (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)pxVar13,pxVar13->node,
               "It is an error for both \'length\' and either of \'minLength\' or \'maxLength\' to be specified on the same type definition"
               ,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
  }
  if (facet1_00 != (xmlSchemaFacetPtr)0x0 && facet1_01 != (xmlSchemaFacetPtr)0x0) {
    pxVar4 = facet1_01->node;
    pxVar8 = xmlSchemaFacetTypeToString(facet1_01->type);
    pxVar9 = xmlSchemaFacetTypeToString(facet1_00->type);
    str2 = "It is an error for both \'%s\' and \'%s\' to be specified on the same type definition";
    xmlSchemaPCustomErrExt
              (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)facet1_01,pxVar4,
               "It is an error for both \'%s\' and \'%s\' to be specified on the same type definition"
               ,pxVar8,pxVar9,(xmlChar *)0x0);
  }
  if (local_d0 != (xmlSchemaFacetPtr)0x0 && local_c8 != (xmlSchemaFacetPtr)0x0) {
    pxVar4 = local_c8->node;
    pxVar8 = xmlSchemaFacetTypeToString(local_c8->type);
    pxVar9 = xmlSchemaFacetTypeToString(local_d0->type);
    str2 = "It is an error for both \'%s\' and \'%s\' to be specified on the same type definition";
    xmlSchemaPCustomErrExt
              (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)local_c8,pxVar4,
               "It is an error for both \'%s\' and \'%s\' to be specified on the same type definition"
               ,pxVar8,pxVar9,(xmlChar *)0x0);
  }
  if ((pxVar13 == (xmlSchemaFacetPtr)0x0) || (local_70 == (xmlSchemaFacetPtr)0x0)) {
LAB_001bea92:
    if ((local_90 != (xmlSchemaFacetPtr)0x0) && (facet2 != (xmlSchemaFacetPtr)0x0)) {
      iVar6 = xmlSchemaCompareValues(local_90->val,facet2->val);
      if (iVar6 == -2) goto LAB_001bf61b;
      if (iVar6 != 0) {
        if (iVar6 == -1) {
          str2 = &DAT_00000001;
          xmlSchemaDeriveFacetErr(pctxt,local_90,facet2,1,1,1);
        }
        if (facet2->fixed != 0) {
          str2 = "The base type\'s facet is \'fixed\', thus the value must not differ";
          xmlSchemaPCustomErrExt
                    (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)local_90,
                     local_90->node,
                     "The base type\'s facet is \'fixed\', thus the value must not differ",
                     (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
        }
      }
    }
    if ((local_78 != (xmlSchemaFacetPtr)0x0) && (facet2_00 != (xmlSchemaFacetPtr)0x0)) {
      iVar6 = xmlSchemaCompareValues(local_78->val,facet2_00->val);
      if (iVar6 == -2) goto LAB_001bf61b;
      if (iVar6 != 0) {
        if (iVar6 == 1) {
          str2 = &DAT_00000001;
          xmlSchemaDeriveFacetErr(pctxt,local_78,facet2_00,-1,1,1);
        }
        if (facet2_00->fixed != 0) {
          str2 = "The base type\'s facet is \'fixed\', thus the value must not differ";
          xmlSchemaPCustomErrExt
                    (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)local_78,
                     local_78->node,
                     "The base type\'s facet is \'fixed\', thus the value must not differ",
                     (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
        }
      }
    }
    if (pxVar13 != (xmlSchemaFacetPtr)0x0) {
      local_70 = pxVar13;
    }
    if (local_70 != (xmlSchemaFacetPtr)0x0) {
      if (local_90 != (xmlSchemaFacetPtr)0x0) {
        facet2 = local_90;
      }
      if (facet2 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(local_70->val,facet2->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 == -1) {
          str2 = &DAT_00000001;
          xmlSchemaDeriveFacetErr(pctxt,local_70,facet2,1,1,0);
        }
      }
      if (local_78 != (xmlSchemaFacetPtr)0x0) {
        facet2_00 = local_78;
      }
      if (facet2_00 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(local_70->val,facet2_00->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 == 1) {
          str2 = &DAT_00000001;
          xmlSchemaDeriveFacetErr(pctxt,local_70,facet2_00,-1,1,0);
        }
      }
    }
    if (facet1_01 != (xmlSchemaFacetPtr)0x0) {
      if (local_c8 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(facet1_01->val,local_c8->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 == -1) {
          str2 = &DAT_00000001;
          xmlSchemaDeriveFacetErr(pctxt,facet1_01,local_c8,1,1,0);
        }
      }
      if (local_98 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(facet1_01->val,local_98->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 != 0) {
          if (iVar6 == 1) {
            str2 = &DAT_00000001;
            xmlSchemaDeriveFacetErr(pctxt,facet1_01,local_98,-1,1,1);
          }
          if (local_98->fixed != 0) {
            str2 = "The base type\'s facet is \'fixed\', thus the value must not differ";
            xmlSchemaPCustomErrExt
                      (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)facet1_01,
                       facet1_01->node,
                       "The base type\'s facet is \'fixed\', thus the value must not differ",
                       (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
          }
        }
      }
      if (local_b8 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(facet1_01->val,local_b8->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 != -1) {
          str2 = (char *)0x0;
          xmlSchemaDeriveFacetErr(pctxt,facet1_01,local_b8,-1,0,1);
        }
      }
      if (local_a0 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(facet1_01->val,local_a0->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 == -1) {
          str2 = &DAT_00000001;
          xmlSchemaDeriveFacetErr(pctxt,facet1_01,local_a0,1,1,1);
        }
      }
      if (local_b0 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(facet1_01->val,local_b0->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 != 1) {
          str2 = (char *)0x0;
          xmlSchemaDeriveFacetErr(pctxt,facet1_01,local_b0,1,0,1);
        }
      }
    }
    if (facet1_00 != (xmlSchemaFacetPtr)0x0) {
      if (local_d0 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(facet1_00->val,local_d0->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 == -1) {
          str2 = &DAT_00000001;
          xmlSchemaDeriveFacetErr(pctxt,facet1_00,local_d0,1,1,0);
        }
      }
      if (local_b8 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(facet1_00->val,local_b8->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 != 0) {
          if (iVar6 == 1) {
            str2 = &DAT_00000001;
            xmlSchemaDeriveFacetErr(pctxt,facet1_00,local_b8,-1,1,1);
          }
          if (local_b8->fixed != 0) {
            str2 = "The base type\'s facet is \'fixed\', thus the value must not differ";
            xmlSchemaPCustomErrExt
                      (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)facet1_00,
                       facet1_00->node,
                       "The base type\'s facet is \'fixed\', thus the value must not differ",
                       (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
          }
        }
      }
      if (local_98 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(facet1_00->val,local_98->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 == 1) {
          str2 = &DAT_00000001;
          xmlSchemaDeriveFacetErr(pctxt,facet1_00,local_98,-1,1,1);
        }
      }
      if (local_a0 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(facet1_00->val,local_a0->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 != 1) {
          str2 = (char *)0x0;
          xmlSchemaDeriveFacetErr(pctxt,facet1_00,local_a0,1,0,1);
        }
      }
      if (local_b0 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(facet1_00->val,local_b0->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 != 1) {
          str2 = (char *)0x0;
          xmlSchemaDeriveFacetErr(pctxt,facet1_00,local_b0,1,0,1);
        }
      }
    }
    if (local_d0 != (xmlSchemaFacetPtr)0x0) {
      if (facet1_01 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(local_d0->val,facet1_01->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 != -1) {
          str2 = (char *)0x0;
          xmlSchemaDeriveFacetErr(pctxt,local_d0,facet1_01,-1,0,0);
        }
      }
      if (local_b0 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(local_d0->val,local_b0->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 != 0) {
          if (iVar6 == -1) {
            str2 = &DAT_00000001;
            xmlSchemaDeriveFacetErr(pctxt,local_d0,local_b0,1,1,1);
          }
          if (local_b0->fixed != 0) {
            str2 = "The base type\'s facet is \'fixed\', thus the value must not differ";
            xmlSchemaPCustomErrExt
                      (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)local_d0,
                       local_d0->node,
                       "The base type\'s facet is \'fixed\', thus the value must not differ",
                       (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
          }
        }
      }
      if (local_98 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(local_d0->val,local_98->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 == 1) {
          str2 = &DAT_00000001;
          xmlSchemaDeriveFacetErr(pctxt,local_d0,local_98,-1,1,1);
        }
      }
      if (local_a0 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(local_d0->val,local_a0->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 == -1) {
          str2 = &DAT_00000001;
          xmlSchemaDeriveFacetErr(pctxt,local_d0,local_a0,1,1,1);
        }
      }
      if (local_b8 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(local_d0->val,local_b8->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 != -1) {
          str2 = (char *)0x0;
          xmlSchemaDeriveFacetErr(pctxt,local_d0,local_b8,-1,0,1);
        }
      }
    }
    if (local_c8 != (xmlSchemaFacetPtr)0x0) {
      if (facet1_00 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(local_c8->val,facet1_00->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 != -1) {
          str2 = (char *)0x0;
          xmlSchemaDeriveFacetErr(pctxt,local_c8,facet1_00,-1,0,0);
        }
      }
      if (local_a0 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(local_c8->val,local_a0->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 != 0) {
          if (iVar6 == -1) {
            str2 = &DAT_00000001;
            xmlSchemaDeriveFacetErr(pctxt,local_c8,local_a0,1,1,1);
          }
          if (local_a0->fixed != 0) {
            str2 = "The base type\'s facet is \'fixed\', thus the value must not differ";
            xmlSchemaPCustomErrExt
                      (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)local_c8,
                       local_c8->node,
                       "The base type\'s facet is \'fixed\', thus the value must not differ",
                       (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
          }
        }
      }
      if (local_98 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(local_c8->val,local_98->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 == 1) {
          str2 = &DAT_00000001;
          xmlSchemaDeriveFacetErr(pctxt,local_c8,local_98,-1,1,1);
        }
      }
      if (local_b0 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(local_c8->val,local_b0->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 != 1) {
          str2 = (char *)0x0;
          xmlSchemaDeriveFacetErr(pctxt,local_c8,local_b0,1,0,1);
        }
      }
      if (local_b8 != (xmlSchemaFacetPtr)0x0) {
        iVar6 = xmlSchemaCompareValues(local_c8->val,local_b8->val);
        if (iVar6 == -2) goto LAB_001bf61b;
        if (iVar6 != -1) {
          str2 = (char *)0x0;
          xmlSchemaDeriveFacetErr(pctxt,local_c8,local_b8,-1,0,1);
        }
      }
    }
    if ((facet1 != (xmlSchemaFacetPtr)0x0) && (pxVar10 != (xmlSchemaFacetPtr)0x0)) {
      iVar6 = xmlSchemaCompareValues(facet1->val,pxVar10->val);
      if (iVar6 == -2) goto LAB_001bf61b;
      if (iVar6 != 0) {
        if (iVar6 == 1) {
          str2 = &DAT_00000001;
          xmlSchemaDeriveFacetErr(pctxt,facet1,pxVar10,-1,1,1);
        }
        if (pxVar10->fixed != 0) {
          str2 = "The base type\'s facet is \'fixed\', thus the value must not differ";
          xmlSchemaPCustomErrExt
                    (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)facet1,
                     facet1->node,
                     "The base type\'s facet is \'fixed\', thus the value must not differ",
                     (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
        }
      }
    }
    if ((pxVar14 != (xmlSchemaFacetPtr)0x0) && (local_58 != (xmlSchemaFacetPtr)0x0)) {
      iVar6 = xmlSchemaCompareValues(pxVar14->val,local_58->val);
      if (iVar6 == -2) goto LAB_001bf61b;
      if (iVar6 != 0) {
        if (iVar6 == 1) {
          str2 = &DAT_00000001;
          xmlSchemaDeriveFacetErr(pctxt,pxVar14,local_58,-1,1,1);
        }
        if (local_58->fixed != 0) {
          str2 = "The base type\'s facet is \'fixed\', thus the value must not differ";
          xmlSchemaPCustomErrExt
                    (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)pxVar14,
                     pxVar14->node,
                     "The base type\'s facet is \'fixed\', thus the value must not differ",
                     (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
        }
      }
    }
    if (facet1 != (xmlSchemaFacetPtr)0x0) {
      pxVar10 = facet1;
    }
    if (pxVar14 != (xmlSchemaFacetPtr)0x0) {
      local_58 = pxVar14;
    }
    if ((pxVar10 != (xmlSchemaFacetPtr)0x0) && (local_58 != (xmlSchemaFacetPtr)0x0)) {
      iVar6 = xmlSchemaCompareValues(local_58->val,pxVar10->val);
      if (iVar6 == -2) goto LAB_001bf61b;
      if (iVar6 == 1) {
        xmlSchemaDeriveFacetErr(pctxt,local_58,pxVar10,-1,1,0);
      }
    }
    pxVar7 = pxVar2->facetSet;
    if (pxVar7 == (xmlSchemaFacetLinkPtr)0x0) {
      iVar6 = 0;
    }
    else {
      do {
        pxVar13 = pxVar7->facet;
        xVar1 = pxVar13->type;
        pxVar12 = (xmlSchemaFacetLinkPtr)&type->facetSet;
        pxVar11 = pxVar15;
        if ((xVar1 & ~XML_SCHEMA_TYPE_BASIC) != XML_SCHEMA_FACET_PATTERN) {
          do {
            pxVar12 = pxVar12->next;
            if (pxVar12 == (xmlSchemaFacetLinkPtr)0x0) {
              pxVar11 = (xmlSchemaFacetLinkPtr)(*xmlMalloc)(0x10);
              if (pxVar11 != (xmlSchemaFacetLinkPtr)0x0) {
                pxVar11->facet = pxVar7->facet;
                pxVar11->next = (_xmlSchemaFacetLink *)0x0;
                if (pxVar15 == (xmlSchemaFacetLinkPtr)0x0) {
                  type->facetSet = pxVar11;
                }
                else {
                  pxVar15->next = pxVar11;
                }
                goto LAB_001bf60a;
              }
              if (pctxt != (xmlSchemaParserCtxtPtr)0x0) {
                pctxt->nberrors = pctxt->nberrors + 1;
              }
              __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,
                               "deriving facets, creating a facet link");
              goto LAB_001bf633;
            }
            pxVar14 = pxVar12->facet;
          } while (pxVar14->type != xVar1);
          if (xVar1 == XML_SCHEMA_FACET_WHITESPACE) {
            if (pxVar14->whitespace < pxVar13->whitespace) {
              xmlSchemaPCustomErrExt
                        (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)pxVar14,
                         pxVar14->node,
                         "The \'whitespace\' value has to be equal to or stronger than the \'whitespace\' value of the base type"
                         ,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
            }
            if ((pxVar13->fixed != 0) && (pxVar14->whitespace != pxVar13->whitespace)) {
              xmlSchemaPCustomErrExt
                        (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)pxVar14,
                         pxVar14->node,
                         "The base type\'s facet is \'fixed\', thus the value must not differ",
                         (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
            }
          }
        }
LAB_001bf60a:
        pxVar7 = pxVar7->next;
        iVar6 = 0;
        pxVar15 = pxVar11;
      } while (pxVar7 != (_xmlSchemaFacetLink *)0x0);
    }
  }
  else {
    iVar6 = xmlSchemaCompareValues(pxVar13->val,local_70->val);
    if (iVar6 != -2) {
      if (iVar6 != 0) {
        str2 = (char *)0x0;
        xmlSchemaDeriveFacetErr(pctxt,pxVar13,local_70,0,0,1);
        if (local_70->fixed != 0) {
          str2 = "The base type\'s facet is \'fixed\', thus the value must not differ";
          xmlSchemaPCustomErrExt
                    (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)pxVar13,
                     pxVar13->node,
                     "The base type\'s facet is \'fixed\', thus the value must not differ",
                     (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
        }
      }
      goto LAB_001bea92;
    }
LAB_001bf61b:
    xmlSchemaInternalErr2
              ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaDeriveAndValidateFacets",
               "an error occurred",(xmlChar *)0x0,(xmlChar *)str2);
LAB_001bf633:
    iVar6 = -1;
  }
  return iVar6;
}

Assistant:

static int
xmlSchemaDeriveAndValidateFacets(xmlSchemaParserCtxtPtr pctxt,
				 xmlSchemaTypePtr type)
{
    xmlSchemaTypePtr base = type->baseType;
    xmlSchemaFacetLinkPtr link, cur, last = NULL;
    xmlSchemaFacetPtr facet, bfacet,
	flength = NULL, ftotdig = NULL, ffracdig = NULL,
	fmaxlen = NULL, fminlen = NULL, /* facets of the current type */
	fmininc = NULL, fmaxinc = NULL,
	fminexc = NULL, fmaxexc = NULL,
	bflength = NULL, bftotdig = NULL, bffracdig = NULL,
	bfmaxlen = NULL, bfminlen = NULL, /* facets of the base type */
	bfmininc = NULL, bfmaxinc = NULL,
	bfminexc = NULL, bfmaxexc = NULL;
    int res; /* err = 0, fixedErr; */

    /*
    * SPEC st-restrict-facets 1:
    * "The {variety} of R is the same as that of B."
    */
    /*
    * SPEC st-restrict-facets 2:
    * "If {variety} is atomic, the {primitive type definition}
    * of R is the same as that of B."
    *
    * NOTE: we leave 1 & 2 out for now, since this will be
    * satisfied by the derivation process.
    * CONSTRUCTION TODO: Maybe needed if using a construction API.
    */
    /*
    * SPEC st-restrict-facets 3:
    * "The {facets} of R are the union of S and the {facets}
    * of B, eliminating duplicates. To eliminate duplicates,
    * when a facet of the same kind occurs in both S and the
    * {facets} of B, the one in the {facets} of B is not
    * included, with the exception of enumeration and pattern
    * facets, for which multiple occurrences with distinct values
    * are allowed."
    */

    if ((type->facetSet == NULL) && (base->facetSet == NULL))
	return (0);

    last = type->facetSet;
    if (last != NULL)
	while (last->next != NULL)
	    last = last->next;

    for (cur = type->facetSet; cur != NULL; cur = cur->next) {
	facet = cur->facet;
	switch (facet->type) {
	    case XML_SCHEMA_FACET_LENGTH:
		flength = facet; break;
	    case XML_SCHEMA_FACET_MINLENGTH:
		fminlen = facet; break;
	    case XML_SCHEMA_FACET_MININCLUSIVE:
		fmininc = facet; break;
	    case XML_SCHEMA_FACET_MINEXCLUSIVE:
		fminexc = facet; break;
	    case XML_SCHEMA_FACET_MAXLENGTH:
		fmaxlen = facet; break;
	    case XML_SCHEMA_FACET_MAXINCLUSIVE:
		fmaxinc = facet; break;
	    case XML_SCHEMA_FACET_MAXEXCLUSIVE:
		fmaxexc = facet; break;
	    case XML_SCHEMA_FACET_TOTALDIGITS:
		ftotdig = facet; break;
	    case XML_SCHEMA_FACET_FRACTIONDIGITS:
		ffracdig = facet; break;
	    default:
		break;
	}
    }
    for (cur = base->facetSet; cur != NULL; cur = cur->next) {
	facet = cur->facet;
	switch (facet->type) {
	    case XML_SCHEMA_FACET_LENGTH:
		bflength = facet; break;
	    case XML_SCHEMA_FACET_MINLENGTH:
		bfminlen = facet; break;
	    case XML_SCHEMA_FACET_MININCLUSIVE:
		bfmininc = facet; break;
	    case XML_SCHEMA_FACET_MINEXCLUSIVE:
		bfminexc = facet; break;
	    case XML_SCHEMA_FACET_MAXLENGTH:
		bfmaxlen = facet; break;
	    case XML_SCHEMA_FACET_MAXINCLUSIVE:
		bfmaxinc = facet; break;
	    case XML_SCHEMA_FACET_MAXEXCLUSIVE:
		bfmaxexc = facet; break;
	    case XML_SCHEMA_FACET_TOTALDIGITS:
		bftotdig = facet; break;
	    case XML_SCHEMA_FACET_FRACTIONDIGITS:
		bffracdig = facet; break;
	    default:
		break;
	}
    }
    /*
    * length and minLength or maxLength (2.2) + (3.2)
    */
    if (flength && (fminlen || fmaxlen)) {
	FACET_RESTR_ERR(flength, "It is an error for both 'length' and "
	    "either of 'minLength' or 'maxLength' to be specified on "
	    "the same type definition")
    }
    /*
    * Mutual exclusions in the same derivation step.
    */
    if ((fmaxinc) && (fmaxexc)) {
	/*
	* SCC "maxInclusive and maxExclusive"
	*/
	FACET_RESTR_MUTUAL_ERR(fmaxinc, fmaxexc)
    }
    if ((fmininc) && (fminexc)) {
	/*
	* SCC "minInclusive and minExclusive"
	*/
	FACET_RESTR_MUTUAL_ERR(fmininc, fminexc)
    }

    if (flength && bflength) {
	/*
	* SCC "length valid restriction"
	* The values have to be equal.
	*/
	res = xmlSchemaCompareValues(flength->val, bflength->val);
	if (res == -2)
	    goto internal_error;
	if (res != 0)
	    xmlSchemaDeriveFacetErr(pctxt, flength, bflength, 0, 0, 1);
	if ((res != 0) && (bflength->fixed)) {
	    FACET_RESTR_FIXED_ERR(flength)
	}

    }
    if (fminlen && bfminlen) {
	/*
	* SCC "minLength valid restriction"
	* minLength >= BASE minLength
	*/
	res = xmlSchemaCompareValues(fminlen->val, bfminlen->val);
	if (res == -2)
	    goto internal_error;
	if (res == -1)
	    xmlSchemaDeriveFacetErr(pctxt, fminlen, bfminlen, 1, 1, 1);
	if ((res != 0) && (bfminlen->fixed)) {
	    FACET_RESTR_FIXED_ERR(fminlen)
	}
    }
    if (fmaxlen && bfmaxlen) {
	/*
	* SCC "maxLength valid restriction"
	* maxLength <= BASE minLength
	*/
	res = xmlSchemaCompareValues(fmaxlen->val, bfmaxlen->val);
	if (res == -2)
	    goto internal_error;
	if (res == 1)
	    xmlSchemaDeriveFacetErr(pctxt, fmaxlen, bfmaxlen, -1, 1, 1);
	if ((res != 0) && (bfmaxlen->fixed)) {
	    FACET_RESTR_FIXED_ERR(fmaxlen)
	}
    }
    /*
    * SCC "length and minLength or maxLength"
    */
    if (! flength)
	flength = bflength;
    if (flength) {
	if (! fminlen)
	    fminlen = bfminlen;
	if (fminlen) {
	    /* (1.1) length >= minLength */
	    res = xmlSchemaCompareValues(flength->val, fminlen->val);
	    if (res == -2)
		goto internal_error;
	    if (res == -1)
		xmlSchemaDeriveFacetErr(pctxt, flength, fminlen, 1, 1, 0);
	}
	if (! fmaxlen)
	    fmaxlen = bfmaxlen;
	if (fmaxlen) {
	    /* (2.1) length <= maxLength */
	    res = xmlSchemaCompareValues(flength->val, fmaxlen->val);
	    if (res == -2)
		goto internal_error;
	    if (res == 1)
		xmlSchemaDeriveFacetErr(pctxt, flength, fmaxlen, -1, 1, 0);
	}
    }
    if (fmaxinc) {
	/*
	* "maxInclusive"
	*/
	if (fmininc) {
	    /* SCC "maxInclusive >= minInclusive" */
	    res = xmlSchemaCompareValues(fmaxinc->val, fmininc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == -1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxinc, fmininc, 1, 1, 0);
	    }
	}
	/*
	* SCC "maxInclusive valid restriction"
	*/
	if (bfmaxinc) {
	    /* maxInclusive <= BASE maxInclusive */
	    res = xmlSchemaCompareValues(fmaxinc->val, bfmaxinc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == 1)
		xmlSchemaDeriveFacetErr(pctxt, fmaxinc, bfmaxinc, -1, 1, 1);
	    if ((res != 0) && (bfmaxinc->fixed)) {
		FACET_RESTR_FIXED_ERR(fmaxinc)
	    }
	}
	if (bfmaxexc) {
	    /* maxInclusive < BASE maxExclusive */
	    res = xmlSchemaCompareValues(fmaxinc->val, bfmaxexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != -1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxinc, bfmaxexc, -1, 0, 1);
	    }
	}
	if (bfmininc) {
	    /* maxInclusive >= BASE minInclusive */
	    res = xmlSchemaCompareValues(fmaxinc->val, bfmininc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == -1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxinc, bfmininc, 1, 1, 1);
	    }
	}
	if (bfminexc) {
	    /* maxInclusive > BASE minExclusive */
	    res = xmlSchemaCompareValues(fmaxinc->val, bfminexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != 1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxinc, bfminexc, 1, 0, 1);
	    }
	}
    }
    if (fmaxexc) {
	/*
	* "maxExclusive >= minExclusive"
	*/
	if (fminexc) {
	    res = xmlSchemaCompareValues(fmaxexc->val, fminexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == -1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxexc, fminexc, 1, 1, 0);
	    }
	}
	/*
	* "maxExclusive valid restriction"
	*/
	if (bfmaxexc) {
	    /* maxExclusive <= BASE maxExclusive */
	    res = xmlSchemaCompareValues(fmaxexc->val, bfmaxexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == 1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxexc, bfmaxexc, -1, 1, 1);
	    }
	    if ((res != 0) && (bfmaxexc->fixed)) {
		FACET_RESTR_FIXED_ERR(fmaxexc)
	    }
	}
	if (bfmaxinc) {
	    /* maxExclusive <= BASE maxInclusive */
	    res = xmlSchemaCompareValues(fmaxexc->val, bfmaxinc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == 1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxexc, bfmaxinc, -1, 1, 1);
	    }
	}
	if (bfmininc) {
	    /* maxExclusive > BASE minInclusive */
	    res = xmlSchemaCompareValues(fmaxexc->val, bfmininc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != 1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxexc, bfmininc, 1, 0, 1);
	    }
	}
	if (bfminexc) {
	    /* maxExclusive > BASE minExclusive */
	    res = xmlSchemaCompareValues(fmaxexc->val, bfminexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != 1) {
		xmlSchemaDeriveFacetErr(pctxt, fmaxexc, bfminexc, 1, 0, 1);
	    }
	}
    }
    if (fminexc) {
	/*
	* "minExclusive < maxInclusive"
	*/
	if (fmaxinc) {
	    res = xmlSchemaCompareValues(fminexc->val, fmaxinc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != -1) {
		xmlSchemaDeriveFacetErr(pctxt, fminexc, fmaxinc, -1, 0, 0);
	    }
	}
	/*
	* "minExclusive valid restriction"
	*/
	if (bfminexc) {
	    /* minExclusive >= BASE minExclusive */
	    res = xmlSchemaCompareValues(fminexc->val, bfminexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == -1) {
		xmlSchemaDeriveFacetErr(pctxt, fminexc, bfminexc, 1, 1, 1);
	    }
	    if ((res != 0) && (bfminexc->fixed)) {
		FACET_RESTR_FIXED_ERR(fminexc)
	    }
	}
	if (bfmaxinc) {
	    /* minExclusive <= BASE maxInclusive */
	    res = xmlSchemaCompareValues(fminexc->val, bfmaxinc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == 1) {
		xmlSchemaDeriveFacetErr(pctxt, fminexc, bfmaxinc, -1, 1, 1);
	    }
	}
	if (bfmininc) {
	    /* minExclusive >= BASE minInclusive */
	    res = xmlSchemaCompareValues(fminexc->val, bfmininc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == -1) {
		xmlSchemaDeriveFacetErr(pctxt, fminexc, bfmininc, 1, 1, 1);
	    }
	}
	if (bfmaxexc) {
	    /* minExclusive < BASE maxExclusive */
	    res = xmlSchemaCompareValues(fminexc->val, bfmaxexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != -1) {
		xmlSchemaDeriveFacetErr(pctxt, fminexc, bfmaxexc, -1, 0, 1);
	    }
	}
    }
    if (fmininc) {
	/*
	* "minInclusive < maxExclusive"
	*/
	if (fmaxexc) {
	    res = xmlSchemaCompareValues(fmininc->val, fmaxexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != -1) {
		xmlSchemaDeriveFacetErr(pctxt, fmininc, fmaxexc, -1, 0, 0);
	    }
	}
	/*
	* "minExclusive valid restriction"
	*/
	if (bfmininc) {
	    /* minInclusive >= BASE minInclusive */
	    res = xmlSchemaCompareValues(fmininc->val, bfmininc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == -1) {
		xmlSchemaDeriveFacetErr(pctxt, fmininc, bfmininc, 1, 1, 1);
	    }
	    if ((res != 0) && (bfmininc->fixed)) {
		FACET_RESTR_FIXED_ERR(fmininc)
	    }
	}
	if (bfmaxinc) {
	    /* minInclusive <= BASE maxInclusive */
	    res = xmlSchemaCompareValues(fmininc->val, bfmaxinc->val);
	    if (res == -2)
		goto internal_error;
	    if (res == 1) {
		xmlSchemaDeriveFacetErr(pctxt, fmininc, bfmaxinc, -1, 1, 1);
	    }
	}
	if (bfminexc) {
	    /* minInclusive > BASE minExclusive */
	    res = xmlSchemaCompareValues(fmininc->val, bfminexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != 1)
		xmlSchemaDeriveFacetErr(pctxt, fmininc, bfminexc, 1, 0, 1);
	}
	if (bfmaxexc) {
	    /* minInclusive < BASE maxExclusive */
	    res = xmlSchemaCompareValues(fmininc->val, bfmaxexc->val);
	    if (res == -2)
		goto internal_error;
	    if (res != -1)
		xmlSchemaDeriveFacetErr(pctxt, fmininc, bfmaxexc, -1, 0, 1);
	}
    }
    if (ftotdig && bftotdig) {
	/*
	* SCC " totalDigits valid restriction"
	* totalDigits <= BASE totalDigits
	*/
	res = xmlSchemaCompareValues(ftotdig->val, bftotdig->val);
	if (res == -2)
	    goto internal_error;
	if (res == 1)
	    xmlSchemaDeriveFacetErr(pctxt, ftotdig, bftotdig,
	    -1, 1, 1);
	if ((res != 0) && (bftotdig->fixed)) {
	    FACET_RESTR_FIXED_ERR(ftotdig)
	}
    }
    if (ffracdig && bffracdig) {
	/*
	* SCC  "fractionDigits valid restriction"
	* fractionDigits <= BASE fractionDigits
	*/
	res = xmlSchemaCompareValues(ffracdig->val, bffracdig->val);
	if (res == -2)
	    goto internal_error;
	if (res == 1)
	    xmlSchemaDeriveFacetErr(pctxt, ffracdig, bffracdig,
	    -1, 1, 1);
	if ((res != 0) && (bffracdig->fixed)) {
	    FACET_RESTR_FIXED_ERR(ffracdig)
	}
    }
    /*
    * SCC "fractionDigits less than or equal to totalDigits"
    */
    if (! ftotdig)
	ftotdig = bftotdig;
    if (! ffracdig)
	ffracdig = bffracdig;
    if (ftotdig && ffracdig) {
	res = xmlSchemaCompareValues(ffracdig->val, ftotdig->val);
	if (res == -2)
	    goto internal_error;
	if (res == 1)
	    xmlSchemaDeriveFacetErr(pctxt, ffracdig, ftotdig,
		-1, 1, 0);
    }
    /*
    * *Enumerations* won' be added here, since only the first set
    * of enumerations in the ancestor-or-self axis is used
    * for validation, plus we need to use the base type of those
    * enumerations for whitespace.
    *
    * *Patterns*: won't be add here, since they are ORed at
    * type level and ANDed at ancestor level. This will
    * happen during validation by walking the base axis
    * of the type.
    */
    for (cur = base->facetSet; cur != NULL; cur = cur->next) {
	bfacet = cur->facet;
	/*
	* Special handling of enumerations and patterns.
	* TODO: hmm, they should not appear in the set, so remove this.
	*/
	if ((bfacet->type == XML_SCHEMA_FACET_PATTERN) ||
	    (bfacet->type == XML_SCHEMA_FACET_ENUMERATION))
	    continue;
	/*
	* Search for a duplicate facet in the current type.
	*/
	link = type->facetSet;
	/* err = 0; */
	/* fixedErr = 0; */
	while (link != NULL) {
	    facet = link->facet;
	    if (facet->type == bfacet->type) {
		switch (facet->type) {
		    case XML_SCHEMA_FACET_WHITESPACE:
			/*
			* The whitespace must be stronger.
			*/
			if (facet->whitespace < bfacet->whitespace) {
			    FACET_RESTR_ERR(facet,
				"The 'whitespace' value has to be equal to "
				"or stronger than the 'whitespace' value of "
				"the base type")
			}
			if ((bfacet->fixed) &&
			    (facet->whitespace != bfacet->whitespace)) {
			    FACET_RESTR_FIXED_ERR(facet)
			}
			break;
		    default:
			break;
		}
		/* Duplicate found. */
		break;
	    }
	    link = link->next;
	}
	/*
	* If no duplicate was found: add the base types's facet
	* to the set.
	*/
	if (link == NULL) {
	    link = (xmlSchemaFacetLinkPtr)
		xmlMalloc(sizeof(xmlSchemaFacetLink));
	    if (link == NULL) {
		xmlSchemaPErrMemory(pctxt,
		    "deriving facets, creating a facet link", NULL);
		return (-1);
	    }
	    link->facet = cur->facet;
	    link->next = NULL;
	    if (last == NULL)
		type->facetSet = link;
	    else
		last->next = link;
	    last = link;
	}

    }

    return (0);
internal_error:
    PERROR_INT("xmlSchemaDeriveAndValidateFacets",
	"an error occurred");
    return (-1);
}